

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

int32_t decShiftToMost(uint8_t *uar,int32_t digits,int32_t shift)

{
  int iVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  uVar8 = (ulong)(uint)digits;
  if (shift == 0) {
    return digits;
  }
  uVar9 = shift + digits;
  if ((int)uVar9 < 2) {
    *uar = *uar * (char)DECPOWERS[shift];
    return uVar9;
  }
  if (digits < 0x32) {
    uVar8 = (ulong)""[digits];
  }
  pbVar6 = uar + (uVar8 - 1);
  if (shift < 0x32) {
    uVar8 = (ulong)""[shift];
    uVar13 = (uint)""[shift];
  }
  else {
    uVar8 = (ulong)(uint)shift;
    uVar13 = shift;
  }
  pbVar7 = pbVar6 + uVar8;
  iVar1 = (shift - uVar13) + 1;
  if (iVar1 == 1) {
    if (pbVar6 < uar) goto LAB_00249b38;
    do {
      pbVar6[uVar8] = *pbVar6;
      pbVar6 = pbVar6 + -1;
    } while (uar <= pbVar6);
    iVar10 = 0;
  }
  else {
    uVar12 = uVar9;
    if (uVar9 < 0x32) {
      uVar12 = (uint)""[uVar9];
    }
    iVar10 = 0;
    iVar11 = 0;
    if (pbVar6 < uar) goto LAB_00249b3b;
    iVar11 = -(shift - uVar13);
    uVar3 = multies[iVar11];
    uVar4 = DECPOWERS[iVar11];
    uVar5 = DECPOWERS[iVar1];
    do {
      bVar2 = *pbVar6;
      uVar13 = (bVar2 >> ((byte)iVar11 & 0x1f)) * uVar3 >> 0x11;
      if (pbVar6 + uVar8 <= uar + ((ulong)uVar12 - 1)) {
        pbVar6[uVar8] = (char)iVar10 + (char)uVar13;
      }
      iVar10 = ((uint)bVar2 - uVar13 * uVar4) * uVar5;
      pbVar6 = pbVar6 + -1;
    } while (uar <= pbVar6);
  }
  pbVar7 = pbVar6 + uVar8;
  iVar11 = iVar10;
LAB_00249b3b:
  while (uar <= pbVar7) {
    *pbVar7 = (byte)iVar11;
    pbVar7 = pbVar7 + -1;
LAB_00249b38:
    iVar11 = 0;
  }
  return uVar9;
}

Assistant:

static Int decShiftToMost(Unit *uar, Int digits, Int shift) {
  Unit  *target, *source, *first;  /* work  */
  Int   cut;                       /* odd 0's to add  */
  uInt  next;                      /* work  */

  if (shift==0) return digits;     /* [fastpath] nothing to do  */
  if ((digits+shift)<=DECDPUN) {   /* [fastpath] single-unit case  */
    *uar=(Unit)(*uar*powers[shift]);
    return digits+shift;
    }

  next=0;                          /* all paths  */
  source=uar+D2U(digits)-1;        /* where msu comes from  */
  target=source+D2U(shift);        /* where upper part of first cut goes  */
  cut=DECDPUN-MSUDIGITS(shift);    /* where to slice  */
  if (cut==0) {                    /* unit-boundary case  */
    for (; source>=uar; source--, target--) *target=*source;
    }
   else {
    first=uar+D2U(digits+shift)-1; /* where msu of source will end up  */
    for (; source>=uar; source--, target--) {
      /* split the source Unit and accumulate remainder for next  */
      #if DECDPUN<=4
        uInt quot=QUOT10(*source, cut);
        uInt rem=*source-quot*powers[cut];
        next+=quot;
      #else
        uInt rem=*source%powers[cut];
        next+=*source/powers[cut];
      #endif
      if (target<=first) *target=(Unit)next;   /* write to target iff valid  */
      next=rem*powers[DECDPUN-cut];            /* save remainder for next Unit  */
      }
    } /* shift-move  */

  /* propagate any partial unit to one below and clear the rest  */
  for (; target>=uar; target--) {
    *target=(Unit)next;
    next=0;
    }
  return digits+shift;
  }